

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatabuffer_p.h
# Opt level: O2

void __thiscall QDataBuffer<unsigned_int>::reserve(QDataBuffer<unsigned_int> *this,qsizetype size)

{
  long lVar1;
  uint *puVar2;
  
  lVar1 = this->capacity;
  if (lVar1 < size) {
    if (lVar1 != 0) goto LAB_003a9537;
    lVar1 = 1;
    while( true ) {
      this->capacity = lVar1;
LAB_003a9537:
      if (size <= lVar1) break;
      lVar1 = lVar1 * 2;
    }
    puVar2 = (uint *)QtPrivate::fittedRealloc(this->buffer,0,&this->capacity,4,0);
    this->buffer = puVar2;
  }
  return;
}

Assistant:

void reserve(qsizetype size) {
        if (size > capacity) {
            if (capacity == 0)
                capacity = 1;
            while (capacity < size)
                capacity *= 2;
            buffer = (Type*) QtPrivate::fittedRealloc(static_cast<void*>(buffer), 0, &capacity, sizeof(Type));
            Q_CHECK_PTR(buffer);
        }
    }